

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_util.c
# Opt level: O0

int struplocompare(char *p1,char *p2)

{
  char *p2_local;
  char *p1_local;
  
  if (p1 == (char *)0x0) {
    p1_local._4_4_ = 0;
    if (p2 != (char *)0x0) {
      p1_local._4_4_ = -1;
    }
  }
  else if (p2 == (char *)0x0) {
    p1_local._4_4_ = 1;
  }
  else {
    p1_local._4_4_ = strcasecmp(p1,p2);
  }
  return p1_local._4_4_;
}

Assistant:

int struplocompare(const char *p1, const char *p2)
{
  if(!p1)
    return p2? -1: 0;
  if(!p2)
    return 1;
#ifdef HAVE_STRCASECMP
  return strcasecmp(p1, p2);
#elif defined(HAVE_STRCMPI)
  return strcmpi(p1, p2);
#elif defined(HAVE_STRICMP)
  return stricmp(p1, p2);
#else
  return strcmp(p1, p2);
#endif
}